

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_std::utf8_time_put_from_wide::do_put
          (utf8_time_put_from_wide *this,iter_type out,ios_base *param_3,char fill,tm *tm,
          char format,char modifier)

{
  time_put *ptVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar5;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  long in_RDI;
  char in_R8B;
  undefined8 in_R9;
  iter_type iVar6;
  char in_stack_00000008;
  char in_stack_00000010;
  uint i;
  string tmp;
  wstring wtmp;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wtmps;
  ostream_type *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  undefined1 uVar7;
  undefined8 in_stack_fffffffffffffd68;
  method_type how;
  string *in_stack_fffffffffffffd70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *text;
  uint local_260;
  undefined1 local_259 [33];
  string local_238 [32];
  wstring local_218 [32];
  undefined8 local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  locale local_1c8;
  long local_1c0 [47];
  undefined8 local_48;
  char local_39;
  ostreambuf_iterator<char,_std::char_traits<char>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  how = (method_type)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_48 = in_R9;
  local_39 = in_R8B;
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1c0);
  std::wios::imbue(&local_1c8);
  std::locale::~locale(&local_1c8);
  ptVar1 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     ((locale *)(in_RDI + 0x10));
  std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::ostreambuf_iterator
            ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  local_1f8 = std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
              put(ptVar1,local_1e8,local_1e0,(long)local_1c0 + *(long *)(local_1c0[0] + -0x18),
                  (int)local_39,local_48,(int)in_stack_00000008,(int)in_stack_00000010);
  local_1f0 = extraout_DL;
  std::__cxx11::wostringstream::str();
  text = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_259 + 1),"UTF-8",(allocator *)text);
  conv::from_utf<wchar_t>(text,in_stack_fffffffffffffd70,how);
  std::__cxx11::string::~string((string *)(local_259 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_259);
  local_260 = 0;
  while( true ) {
    uVar2 = (ulong)local_260;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar2) break;
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_238);
    uVar7 = *puVar4;
    poVar5 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_28,0);
    poVar5 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar5);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              ((ostreambuf_iterator<char,_std::char_traits<char>_> *)
               CONCAT17(uVar7,in_stack_fffffffffffffd60),(char)((ulong)poVar5 >> 0x38));
    local_260 = local_260 + 1;
  }
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::string::~string(local_238);
  std::__cxx11::wstring::~wstring(local_218);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1c0);
  iVar6._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar6._M_failed = (bool)uStack_10;
  iVar6._M_sbuf = local_18;
  return iVar6;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,char fill,std::tm const *tm,char format,char modifier = 0) const
    {
        std::basic_ostringstream<wchar_t> wtmps;
        wtmps.imbue(base_);
        std::use_facet<std::time_put<wchar_t> >(base_).put(wtmps,wtmps,wchar_t(fill),tm,wchar_t(format),wchar_t(modifier));
        std::wstring wtmp=wtmps.str();
        std::string const tmp = conv::from_utf<wchar_t>(wtmp,"UTF-8");
        for(unsigned i=0;i<tmp.size();i++) {
            *out++ = tmp[i];
        }
        return out;
    }